

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall
Generator_hodgkinHuxleySquidAxonModel1952WithConstantsAsExternalVariablesIncludingOneDependingOnTheOther_Test
::TestBody(Generator_hodgkinHuxleySquidAxonModel1952WithConstantsAsExternalVariablesIncludingOneDependingOnTheOther_Test
           *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__r;
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  AssertHelper local_3f8 [8];
  Message local_3f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  allocator<char> local_3c1;
  string local_3c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_360 [8];
  Message local_358 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  allocator<char> local_329;
  string local_328 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_3;
  Message local_2d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  allocator<char> local_2a1;
  string local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_2;
  string local_248 [32];
  undefined1 local_228 [8];
  GeneratorProfilePtr profile;
  GeneratorPtr generator;
  AnalyserModelPtr analyserModel;
  Message local_1f0 [8];
  unsigned_long local_1e8 [2];
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [32];
  shared_ptr<libcellml::Component> local_168;
  shared_ptr<libcellml::Variable> local_158;
  undefined1 local_148 [8];
  AnalyserExternalVariablePtr external_sodium_channel_Cm;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [32];
  shared_ptr<libcellml::Component> local_e8;
  undefined1 local_d8 [8];
  VariablePtr sodium_channel_g_Na;
  AnalyserPtr analyser;
  Message local_b0 [8];
  unsigned_long local_a8 [2];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Generator_hodgkinHuxleySquidAxonModel1952WithConstantsAsExternalVariablesIncludingOneDependingOnTheOther_Test
  *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml",&local_71);
  fileContents(local_50);
  libcellml::Parser::parseModel((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  local_a8[1] = 0;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_a8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_98,"size_t(0)","parser->issueCount()",local_a8 + 1,local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x549,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  libcellml::Analyser::create();
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"sodium_channel",&local_109);
  libcellml::ComponentEntity::component((string *)&local_e8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"g_Na",
             (allocator<char> *)
             ((long)&external_sodium_channel_Cm.
                     super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)local_d8);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&external_sodium_channel_Cm.
                     super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"membrane",&local_189);
  libcellml::ComponentEntity::component((string *)&local_168,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"Cm",&local_1b1);
  libcellml::Component::variable((string *)&local_158);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)local_148);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_158);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_168);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  peVar4 = std::
           __shared_ptr_access<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_148);
  libcellml::AnalyserExternalVariable::addDependency((shared_ptr *)peVar4);
  peVar5 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&sodium_channel_g_Na.
                          super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&gtest_ar_1.message_);
  libcellml::Analyser::addExternalVariable((shared_ptr *)peVar5);
  std::shared_ptr<libcellml::AnalyserExternalVariable>::~shared_ptr
            ((shared_ptr<libcellml::AnalyserExternalVariable> *)&gtest_ar_1.message_);
  peVar5 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&sodium_channel_g_Na.
                          super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Analyser::addExternalVariable((shared_ptr *)peVar5);
  peVar5 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&sodium_channel_g_Na.
                          super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Analyser::analyseModel((shared_ptr *)peVar5);
  local_1e8[1] = 0;
  std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &sodium_channel_g_Na.
              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_1e8[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1d8,"size_t(0)","analyser->errorCount()",local_1e8 + 1,
             local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(local_1f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &analyserModel.
                super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x556,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &analyserModel.
                super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,local_1f0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &analyserModel.
                super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    testing::Message::~Message(local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &sodium_channel_g_Na.
              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Analyser::model();
  libcellml::Generator::create();
  peVar6 = std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&profile.
                            super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  libcellml::Generator::setModel((shared_ptr *)peVar6);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Generator::profile();
  peVar7 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_248,"model.dependent.constant.h",
             (allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  libcellml::GeneratorProfile::setInterfaceFileNameString((string *)peVar7);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a0,"generator/hodgkin_huxley_squid_axon_model_1952/model.dependent.constant.h",
             &local_2a1);
  fileContents((string *)&local_280);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Generator::interfaceCode_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_260,
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.dependent.constant.h\")"
             ,"generator->interfaceCode()",&local_280,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(local_2d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x561,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_328,"generator/hodgkin_huxley_squid_axon_model_1952/model.dependent.constant.c",
             &local_329);
  fileContents((string *)&local_308);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_2e8,
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.dependent.constant.c\")"
             ,"generator->implementationCode()",&local_308,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator(&local_329);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              (local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x562,pcVar2);
    testing::internal::AssertHelper::operator=(local_360,local_358);
    testing::internal::AssertHelper::~AssertHelper(local_360);
    testing::Message::~Message(local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  __r = &gtest_ar_4.message_;
  libcellml::GeneratorProfile::create((Profile)__r);
  std::shared_ptr<libcellml::GeneratorProfile>::operator=
            ((shared_ptr<libcellml::GeneratorProfile> *)local_228,
             (shared_ptr<libcellml::GeneratorProfile> *)__r);
  std::shared_ptr<libcellml::GeneratorProfile>::~shared_ptr
            ((shared_ptr<libcellml::GeneratorProfile> *)__r);
  peVar6 = std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&profile.
                            super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  libcellml::Generator::setProfile((shared_ptr *)peVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c0,"generator/hodgkin_huxley_squid_axon_model_1952/model.dependent.constant.py",
             &local_3c1);
  fileContents((string *)&local_3a0);
  std::__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_380,
             "fileContents(\"generator/hodgkin_huxley_squid_axon_model_1952/model.dependent.constant.py\")"
             ,"generator->implementationCode()",&local_3a0,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(local_3f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              (local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x568,pcVar2);
    testing::internal::AssertHelper::operator=(local_3f8,local_3f0);
    testing::internal::AssertHelper::~AssertHelper(local_3f8);
    testing::Message::~Message(local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  std::shared_ptr<libcellml::GeneratorProfile>::~shared_ptr
            ((shared_ptr<libcellml::GeneratorProfile> *)local_228);
  std::shared_ptr<libcellml::Generator>::~shared_ptr
            ((shared_ptr<libcellml::Generator> *)
             &profile.super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::AnalyserModel>::~shared_ptr
            ((shared_ptr<libcellml::AnalyserModel> *)
             &generator.super___shared_ptr<libcellml::Generator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::AnalyserExternalVariable>::~shared_ptr
            ((shared_ptr<libcellml::AnalyserExternalVariable> *)local_148);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_d8);
  std::shared_ptr<libcellml::Analyser>::~shared_ptr
            ((shared_ptr<libcellml::Analyser> *)
             &sodium_channel_g_Na.
              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Generator, hodgkinHuxleySquidAxonModel1952WithConstantsAsExternalVariablesIncludingOneDependingOnTheOther)
{
    // Generate some code for the HH52 model with membrane.Cm as an external
    // variable which has a dependency on sodium_channel.g_Na, another constant
    // marked as an external variable.

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();
    auto sodium_channel_g_Na = model->component("sodium_channel")->variable("g_Na");
    auto external_sodium_channel_Cm = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("Cm"));

    external_sodium_channel_Cm->addDependency(sodium_channel_g_Na);

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(sodium_channel_g_Na));
    analyser->addExternalVariable(external_sodium_channel_Cm);

    analyser->analyseModel(model);

    EXPECT_EQ(size_t(0), analyser->errorCount());

    auto analyserModel = analyser->model();
    auto generator = libcellml::Generator::create();

    generator->setModel(analyserModel);

    auto profile = generator->profile();

    profile->setInterfaceFileNameString("model.dependent.constant.h");

    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.dependent.constant.h"), generator->interfaceCode());
    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.dependent.constant.c"), generator->implementationCode());

    profile = libcellml::GeneratorProfile::create(libcellml::GeneratorProfile::Profile::PYTHON);

    generator->setProfile(profile);

    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.dependent.constant.py"), generator->implementationCode());
}